

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O0

Hypothesis * __thiscall
sentencepiece::model::FreeList<sentencepiece::unigram::(anonymous_namespace)::Hypothesis>::Allocate
          (FreeList<sentencepiece::unigram::(anonymous_namespace)::Hypothesis> *this)

{
  size_type sVar1;
  value_type pHVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  size_type sVar5;
  ulong uVar6;
  reference ppHVar7;
  Hypothesis *result;
  Hypothesis *chunk;
  FreeList<sentencepiece::unigram::(anonymous_namespace)::Hypothesis> *this_local;
  
  if (this->chunk_size_ <= this->element_index_) {
    this->chunk_index_ = this->chunk_index_ + 1;
    this->element_index_ = 0;
  }
  sVar1 = this->chunk_index_;
  chunk = (Hypothesis *)this;
  sVar5 = std::
          vector<sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_std::allocator<sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>_>
          ::size(&this->freelist_);
  if (sVar1 == sVar5) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = this->chunk_size_;
    uVar6 = SUB168(auVar4 * ZEXT816(0x18),0);
    if (SUB168(auVar4 * ZEXT816(0x18),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    result = (Hypothesis *)operator_new__(uVar6);
    memset(result,0,this->chunk_size_ * 0x18);
    std::
    vector<sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_std::allocator<sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>_>
    ::push_back(&this->freelist_,&result);
  }
  ppHVar7 = std::
            vector<sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*,_std::allocator<sentencepiece::unigram::(anonymous_namespace)::Hypothesis_*>_>
            ::operator[](&this->freelist_,this->chunk_index_);
  pHVar2 = *ppHVar7;
  sVar3 = this->element_index_;
  this->element_index_ = this->element_index_ + 1;
  return pHVar2 + sVar3;
}

Assistant:

T* Allocate() {
    if (element_index_ >= chunk_size_) {
      ++chunk_index_;
      element_index_ = 0;
    }

    if (chunk_index_ == freelist_.size()) {
      T* chunk = new T[chunk_size_];
      memset(static_cast<void*>(chunk), 0, sizeof(*chunk) * chunk_size_);
      freelist_.push_back(chunk);
    }

    T* result = freelist_[chunk_index_] + element_index_;
    ++element_index_;

    return result;
  }